

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.h
# Opt level: O2

void __thiscall shift_window_transformer::Tensor<float>::~Tensor(Tensor<float> *this)

{
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->shape).super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)this);
  return;
}

Assistant:

Tensor() : std::vector<T>() {
        }